

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nested.cpp
# Opt level: O3

tuple<NS_*> test_graphs::exelixis_python_solution(void)

{
  NS *pNVar1;
  NS *this;
  NS *this_00;
  undefined1 (*pauVar2) [16];
  int __fd;
  NS *in_RDI;
  undefined4 uVar3;
  undefined4 uVar11;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __type local_398;
  N *local_378;
  N *local_370;
  N *local_368;
  N *local_360;
  N *local_358;
  NS *local_350;
  NS *local_348;
  NS *local_340;
  NS *local_338;
  _Tuple_impl<0UL,_NS_*> local_330;
  undefined1 local_328 [40];
  _Head_base<21UL,_N_*,_false> _Stack_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  _Head_base<16UL,_N_*,_false> local_2d8;
  _Head_base<13UL,_N_*,_false> local_2c0;
  _Head_base<12UL,_N_*,_false> local_2b8;
  _Head_base<11UL,_N_*,_false> local_2b0;
  _Head_base<10UL,_N_*,_false> local_2a8;
  _Head_base<9UL,_N_*,_false> local_2a0;
  _Head_base<8UL,_N_*,_false> local_298;
  _Head_base<7UL,_N_*,_false> local_290;
  _Head_base<5UL,_N_*,_false> local_280;
  _Head_base<4UL,_N_*,_false> _Stack_278;
  _Head_base<3UL,_N_*,_false> local_270;
  _Head_base<1UL,_N_*,_false> local_260;
  _Head_base<0UL,_N_*,_false> local_258;
  __type local_250;
  __type local_238;
  __type local_208;
  __type local_1e0;
  __type local_1c0;
  __type local_1a0;
  __type local_158;
  __type local_130;
  __type local_a0;
  
  local_330.super__Head_base<0UL,_NS_*,_false>._M_head_impl =
       (_Head_base<0UL,_NS_*,_false>)(_Head_base<0UL,_NS_*,_false>)in_RDI;
  pNVar1 = (NS *)operator_new(0x18);
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  NS::wrap<char_const*,char_const*,char_const*,char_const*>
            (&local_1e0,pNVar1,"Digit","Operator","Parenthese","Symbol");
  NS::wrap<char_const*,char_const*,char_const*>
            (&local_250,pNVar1,"has function","has symbol","has instance");
  local_338 = pNVar1;
  NS::
  wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (&local_130,pNVar1,"+","-","*","/","-","0","1","2","3","4","5","6","7","8","9","(",")",
             " ");
  NS::wrap<char_const*,char_const*,char_const*,char_const*,char_const*>
            (&local_208,pNVar1,"int","add","sub","mul","div");
  auVar12._8_4_ =
       (int)local_130.
            super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .super__Head_base<1UL,_N_*,_false>._M_head_impl;
  auVar12._0_8_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Head_base<0UL,_N_*,_false>._M_head_impl;
  auVar12._12_4_ =
       (int)((ulong)local_130.
                    super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .super__Head_base<1UL,_N_*,_false>._M_head_impl >> 0x20);
  local_328._8_8_ = auVar12._8_8_;
  auVar4._8_4_ = (int)local_130.
                      super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .super__Head_base<3UL,_N_*,_false>._M_head_impl;
  auVar4._0_8_ = local_130.
                 super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .super__Head_base<2UL,_N_*,_false>._M_head_impl;
  auVar4._12_4_ =
       (int)((ulong)local_130.
                    super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .super__Head_base<3UL,_N_*,_false>._M_head_impl >> 0x20);
  local_328._24_8_ = auVar4._8_8_;
  N::connect(local_1e0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)local_328,4);
  auVar5._8_4_ = (int)local_130.
                      super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                      super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                      super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                      super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                      super__Tuple_impl<12UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                      super__Tuple_impl<13UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                      super__Tuple_impl<14UL,_N_*,_N_*,_N_*,_N_*>.
                      super__Tuple_impl<15UL,_N_*,_N_*,_N_*>.super__Tuple_impl<16UL,_N_*,_N_*>.
                      super__Head_base<16UL,_N_*,_false>._M_head_impl;
  auVar5._0_8_ = local_130.
                 super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                 super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                 super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                 super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                 super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                 super__Tuple_impl<12UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                 super__Tuple_impl<13UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                 super__Tuple_impl<14UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<15UL,_N_*,_N_*,_N_*>.
                 super__Head_base<15UL,_N_*,_false>._M_head_impl;
  auVar5._12_4_ =
       (int)((ulong)local_130.
                    super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<12UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<13UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<14UL,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<15UL,_N_*,_N_*,_N_*>.super__Tuple_impl<16UL,_N_*,_N_*>.
                    super__Head_base<16UL,_N_*,_false>._M_head_impl >> 0x20);
  local_328._8_8_ = auVar5._8_8_;
  N::connect(local_1e0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*>.
             super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)local_328,2);
  local_328._0_8_ =
       local_208.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>._M_head_impl;
  N::connect(local_130.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Head_base<0UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_208.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
       super__Head_base<2UL,_N_*,_false>._M_head_impl;
  N::connect(local_130.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Head_base<1UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_208.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl;
  N::connect(local_130.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_208.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
       super__Head_base<4UL,_N_*,_false>._M_head_impl;
  N::connect(local_130.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Head_base<3UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)local_328,1);
  pNVar1 = (NS *)operator_new(0x18);
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (NS *)operator_new(0x18);
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = (NS *)operator_new(0x18);
  (this_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pauVar2 = (undefined1 (*) [16])N::operator_new(0x78,pNVar1);
  *pauVar2 = (undefined1  [16])0x0;
  *(undefined8 *)pauVar2[1] = 0;
  pauVar2[2] = (undefined1  [16])0x0;
  pauVar2[3] = (undefined1  [16])0x0;
  pauVar2[4] = (undefined1  [16])0x0;
  *(NS **)pauVar2[5] = this;
  pauVar2[7][0] = 3;
  local_340 = pNVar1;
  pauVar2 = (undefined1 (*) [16])N::operator_new(0x78,pNVar1);
  *pauVar2 = (undefined1  [16])0x0;
  *(undefined8 *)pauVar2[1] = 0;
  pauVar2[2] = (undefined1  [16])0x0;
  pauVar2[3] = (undefined1  [16])0x0;
  pauVar2[4] = (undefined1  [16])0x0;
  *(NS **)pauVar2[5] = this_00;
  pauVar2[7][0] = 3;
  NS::wrap<char_const*,char_const*,char_const*,char_const*,char_const*>
            (&local_158,pNVar1,"first","second","third","any of","arg");
  NS::wrap<char_const*,char_const*,char_const*,char_const*>
            (&local_1c0,this,"Sequence","Either","ZeroOrMore","OneOrMore");
  NS::
  wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (&local_1a0,this_00,"Chain","Head","Join","Filter","Matches","Map","Fix","Apply","Swap")
  ;
  pNVar1 = (NS *)operator_new(0x18);
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_348 = pNVar1;
  NS::wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (&local_238,pNVar1,"Integer","Digit","Factor","Term","Expression","parser");
  NS::
  wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (&local_a0,pNVar1,"seq","alt","som","alt","alt","seq","seq","mul","seq","alt","seq",
             "mul","seq","alt");
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<0UL,_N_*,_false>._M_head_impl;
  auVar6._8_4_ = (int)local_a0.
                      super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                      super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                      super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                      super__Head_base<6UL,_N_*,_false>._M_head_impl;
  auVar6._0_8_ = local_a0.
                 super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                 super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                 super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                 super__Head_base<5UL,_N_*,_false>._M_head_impl;
  auVar6._12_4_ =
       (int)((ulong)local_a0.
                    super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Head_base<6UL,_N_*,_false>._M_head_impl >> 0x20);
  local_328._16_8_ = auVar6._8_8_;
  local_328._24_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<8UL,_N_*,_false>.
       _M_head_impl;
  N::connect(local_1c0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>.
             _M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)local_328,6);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<1UL,_N_*,_false>._M_head_impl;
  auVar7._8_4_ = (int)local_a0.
                      super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                      super__Head_base<4UL,_N_*,_false>._M_head_impl;
  auVar7._0_8_ = local_a0.
                 super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                 super__Head_base<3UL,_N_*,_false>._M_head_impl;
  auVar7._12_4_ =
       (int)((ulong)local_a0.
                    super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                    super__Head_base<4UL,_N_*,_false>._M_head_impl >> 0x20);
  local_328._16_8_ = auVar7._8_8_;
  local_328._24_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<9UL,_N_*,_false>.
       _M_head_impl;
  N::connect(local_1c0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)local_328,5);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<2UL,_N_*,_false>._M_head_impl;
  N::connect((N *)local_1c0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)local_328,1);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<7UL,_N_*,_false>.
       _M_head_impl;
  local_328._8_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<11UL,_N_*,_N_*,_N_*>.super__Head_base<11UL,_N_*,_false>._M_head_impl;
  N::connect(local_1c0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*>.
             super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)local_328,2);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<0UL,_N_*,_false>._M_head_impl;
  N::connect(local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<0UL,_N_*,_false>._M_head_impl,
             (int)local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<4UL,_N_*,_N_*>.super__Tuple_impl<5UL,_N_*>.
                  super__Head_base<5UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<1UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Head_base<0UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Head_base<4UL,_N_*,_false>._M_head_impl;
  local_328._8_8_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<12UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<13UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<14UL,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<15UL,_N_*,_N_*,_N_*>.super__Tuple_impl<16UL,_N_*,_N_*>.
       super__Tuple_impl<17UL,_N_*>.super__Head_base<17UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Head_base<1UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl,
             (sockaddr *)local_328,2);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<2UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Head_base<0UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
       _M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<3UL,_N_*,_false>._M_head_impl;
  N::connect(local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
             _M_head_impl,
             (int)local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<4UL,_N_*,_N_*>.super__Tuple_impl<5UL,_N_*>.
                  super__Head_base<5UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  auVar8._0_8_ = local_130.
                 super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .super__Head_base<5UL,_N_*,_false>._M_head_impl;
  auVar8._8_4_ = (int)local_130.
                      super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .super__Head_base<6UL,_N_*,_false>._M_head_impl;
  auVar8._12_4_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<6UL,_N_*,_false>._M_head_impl._4_4_;
  local_328._8_8_ = auVar8._8_8_;
  auVar13._0_8_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<7UL,_N_*,_false>._M_head_impl;
  auVar13._8_4_ =
       (int)local_130.
            super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Head_base<8UL,_N_*,_false>._M_head_impl;
  auVar13._12_4_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<8UL,_N_*,_false>._M_head_impl._4_4_;
  local_328._24_8_ = auVar13._8_8_;
  local_328._32_8_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<9UL,_N_*,_false>._M_head_impl;
  register0x00001288 =
       (int)local_130.
            super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Head_base<10UL,_N_*,_false>._M_head_impl;
  register0x0000128c =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<10UL,_N_*,_false>._M_head_impl._4_4_;
  local_2f8._0_8_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<11UL,_N_*,_false>
       ._M_head_impl;
  local_2f8._8_4_ =
       (int)local_130.
            super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<12UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<12UL,_N_*,_false>
            ._M_head_impl;
  local_2f8._12_4_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<12UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<12UL,_N_*,_false>.
       _M_head_impl._4_4_;
  local_2e8._0_8_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<12UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<13UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<13UL,_N_*,_false>.
       _M_head_impl;
  local_2e8._8_4_ =
       (int)local_130.
            super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<12UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<13UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<14UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<14UL,_N_*,_false>.
            _M_head_impl;
  local_2e8._12_4_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<12UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<13UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<14UL,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<14UL,_N_*,_false>._M_head_impl._4_4_;
  local_328._0_8_ = auVar8._0_8_;
  local_328._16_8_ = auVar13._0_8_;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<3UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl,
             (sockaddr *)local_328,10);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<4UL,_N_*,_false>._M_head_impl;
  N::connect(local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>.
             _M_head_impl,
             (int)local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<4UL,_N_*,_N_*>.super__Tuple_impl<5UL,_N_*>.
                  super__Head_base<5UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<5UL,_N_*,_false>._M_head_impl;
  local_328._8_8_ =
       local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<0UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<4UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl,
             (sockaddr *)local_328,2);
  local_328._0_8_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<12UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<13UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<14UL,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<15UL,_N_*,_N_*,_N_*>.super__Head_base<15UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<5UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*,_N_*>.
       super__Head_base<4UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<5UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<11UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<12UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<13UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<14UL,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<15UL,_N_*,_N_*,_N_*>.super__Tuple_impl<16UL,_N_*,_N_*>.
       super__Head_base<16UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<5UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Head_base<2UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<6UL,_N_*,_false>._M_head_impl;
  N::connect(local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.
             super__Head_base<3UL,_N_*,_false>._M_head_impl,
             (int)local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<4UL,_N_*,_N_*>.super__Tuple_impl<5UL,_N_*>.
                  super__Head_base<5UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<2UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<6UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<7UL,_N_*,_false>.
       _M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<6UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<8UL,_N_*,_false>.
       _M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<7UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<9UL,_N_*,_false>.
       _M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<8UL,_N_*,_false>.
             _M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<2UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<8UL,_N_*,_false>.
             _M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)local_328,1);
  auVar9._8_4_ = (int)local_130.
                      super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .
                      super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                      .super__Head_base<3UL,_N_*,_false>._M_head_impl;
  auVar9._0_8_ = local_130.
                 super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .
                 super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                 .super__Head_base<2UL,_N_*,_false>._M_head_impl;
  auVar9._12_4_ =
       (int)((ulong)local_130.
                    super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .super__Head_base<3UL,_N_*,_false>._M_head_impl >> 0x20);
  local_328._8_8_ = auVar9._8_8_;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<9UL,_N_*,_false>.
             _M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl,
             (sockaddr *)local_328,2);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*>.
       super__Head_base<10UL,_N_*,_false>._M_head_impl;
  N::connect(local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*>.super__Head_base<4UL,_N_*,_false>._M_head_impl,
             (int)local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<4UL,_N_*,_N_*>.super__Tuple_impl<5UL,_N_*>.
                  super__Head_base<5UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<10UL,_N_*,_false>.
             _M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<11UL,_N_*,_N_*,_N_*>.super__Head_base<11UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<10UL,_N_*,_false>.
             _M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<11UL,_N_*,_N_*,_N_*>.super__Tuple_impl<12UL,_N_*,_N_*>.
       super__Head_base<12UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<11UL,_N_*,_N_*,_N_*>.
             super__Head_base<11UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_a0.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<11UL,_N_*,_N_*,_N_*>.super__Tuple_impl<12UL,_N_*,_N_*>.
       super__Tuple_impl<13UL,_N_*>.super__Head_base<13UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<11UL,_N_*,_N_*,_N_*>.
             super__Tuple_impl<12UL,_N_*,_N_*>.super__Head_base<12UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)local_328,1);
  local_328._0_8_ =
       local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl;
  N::connect(local_a0.
             super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
             .super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<11UL,_N_*,_N_*,_N_*>.
             super__Tuple_impl<12UL,_N_*,_N_*>.super__Head_base<12UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)local_328,1);
  auVar10._8_4_ =
       (int)local_130.
            super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .
            super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
            .super__Head_base<1UL,_N_*,_false>._M_head_impl;
  auVar10._0_8_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Head_base<0UL,_N_*,_false>._M_head_impl;
  auVar10._12_4_ =
       (int)((ulong)local_130.
                    super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .
                    super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                    .super__Head_base<1UL,_N_*,_false>._M_head_impl >> 0x20);
  local_328._0_8_ =
       local_130.
       super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
       .super__Head_base<0UL,_N_*,_false>._M_head_impl;
  local_328._8_8_ = auVar10._8_8_;
  N::connect((N *)local_a0.
                  super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                  .
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                  .
                  super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
                  .super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<6UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<7UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<8UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<9UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<10UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<11UL,_N_*,_N_*,_N_*>
                  .super__Tuple_impl<12UL,_N_*,_N_*>.super__Tuple_impl<13UL,_N_*>.
                  super__Head_base<13UL,_N_*,_false>._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl,
             (sockaddr *)local_328,2);
  pNVar1 = (NS *)operator_new(0x18);
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_350 = pNVar1;
  local_358 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(local_358,"solver");
  NS::
  wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            ((__type *)local_328,pNVar1,"chain","join","head","chain","filter","filter","head",
             "chain","map","chain","matches","matches","fix","chain","swap","apply","head","chain",
             "map","chain","matches","matches","fix","chain","swap","apply","head");
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Head_base<1UL,_N_*,_false>._M_head_impl = local_290._M_head_impl;
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>.
  _M_head_impl = (N *)local_2e8._8_8_;
  local_378 = local_2a0._M_head_impl;
  local_370 = (N *)local_2f8._8_8_;
  local_368 = local_2c0._M_head_impl;
  local_360 = (N *)local_328._24_8_;
  N::connect(local_1a0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<0UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)&local_398,8);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Head_base<1UL,_N_*,_false>._M_head_impl = local_2d8._M_head_impl;
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>.
  _M_head_impl = (N *)local_328._0_8_;
  N::connect(local_1a0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<1UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)&local_398,4);
  N::connect(local_1a0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)&local_398,1);
  uVar3 = SUB84(local_280._M_head_impl,0);
  uVar11 = (undefined4)((ulong)local_280._M_head_impl >> 0x20);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl._0_1_ =
       (char)uVar3;
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl._1_1_ =
       (char)((uint)uVar3 >> 8);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl._2_1_ =
       (char)((uint)uVar3 >> 0x10);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl._3_1_ =
       (char)((uint)uVar3 >> 0x18);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*>.super__Head_base<3UL,_N_*,_false>.
  _M_head_impl = (_Head_base<3UL,_N_*,_false>)(_Head_base<3UL,_N_*,_false>)_Stack_278._M_head_impl;
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl._4_1_ =
       (char)uVar11;
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl._5_1_ =
       (char)((uint)uVar11 >> 8);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl._6_1_ =
       (char)((uint)uVar11 >> 0x10);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl._7_1_ =
       (char)((uint)uVar11 >> 0x18);
  N::connect(local_1a0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>.
             _M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)&local_398,2);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl =
       (N *)local_2f8._0_8_;
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Head_base<1UL,_N_*,_false>._M_head_impl = local_2b0._M_head_impl;
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>.
  _M_head_impl = _Stack_300._M_head_impl;
  N::connect(local_1a0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<4UL,_N_*,_false>.
             _M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)&local_398,4);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl =
       (N *)local_2e8._0_8_;
  N::connect(local_1a0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<5UL,_N_*,_false>.
             _M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)&local_398,2);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl =
       (N *)local_328._32_8_;
  N::connect(local_1a0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<6UL,_N_*,_N_*,_N_*>.
             super__Head_base<6UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)&local_398,2);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl =
       (N *)local_328._8_8_;
  N::connect(local_1a0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<6UL,_N_*,_N_*,_N_*>.
             super__Tuple_impl<7UL,_N_*,_N_*>.super__Head_base<7UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)&local_398,2);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl =
       (N *)local_328._16_8_;
  N::connect((N *)local_1a0.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<4UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<5UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<6UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<7UL,_N_*,_N_*>.super__Tuple_impl<8UL,_N_*>.
                  super__Head_base<8UL,_N_*,_false>._M_head_impl,
             (int)local_250.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
                  super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl,
             (sockaddr *)&local_398,2);
  __fd = (int)local_358;
  N::connect(local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Head_base<0UL,_N_*,_false>._M_head_impl,__fd,(sockaddr *)&local_398,1);
  N::connect(local_258._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_258._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_260._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
             _M_head_impl,__fd,(sockaddr *)&local_398,1);
  N::connect(local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<2UL,_N_*,_false>.
             _M_head_impl,__fd,(sockaddr *)&local_398,1);
  N::connect(local_270._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_270._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_270._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Head_base<2UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(_Stack_278._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_280._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.
             super__Head_base<3UL,_N_*,_false>._M_head_impl,__fd,(sockaddr *)&local_398,1);
  N::connect(local_290._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_290._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_290._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Head_base<2UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_298._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_2a0._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_2a0._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_2a8._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_2a8._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_2b0._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_2b0._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_2b8._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_2c0._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(local_2c0._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*>.super__Head_base<3UL,_N_*,_false>.
  _M_head_impl = (_Head_base<3UL,_N_*,_false>)(_Head_base<3UL,_N_*,_false>)local_2e8._8_8_;
  N::connect(local_238.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
             super__Tuple_impl<2UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*,_N_*,_N_*>.
             super__Tuple_impl<4UL,_N_*,_N_*>.super__Head_base<4UL,_N_*,_false>._M_head_impl,__fd,
             (sockaddr *)&local_398,1);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*>.super__Head_base<3UL,_N_*,_false>.
  _M_head_impl = (_Head_base<3UL,_N_*,_false>)(_Head_base<3UL,_N_*,_false>)local_2e8._0_8_;
  N::connect((N *)local_2e8._8_8_,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*>.super__Head_base<3UL,_N_*,_false>.
  _M_head_impl = (_Head_base<3UL,_N_*,_false>)(_Head_base<3UL,_N_*,_false>)local_328._32_8_;
  N::connect((N *)local_2e8._8_8_,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  N::connect((N *)local_2e8._8_8_,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Head_base<2UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*>.super__Head_base<3UL,_N_*,_false>.
  _M_head_impl = (_Head_base<3UL,_N_*,_false>)(_Head_base<3UL,_N_*,_false>)local_2f8._8_8_;
  N::connect((N *)local_2e8._0_8_,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*>.super__Head_base<3UL,_N_*,_false>.
  _M_head_impl = (_Head_base<3UL,_N_*,_false>)(_Head_base<3UL,_N_*,_false>)local_2f8._0_8_;
  N::connect((N *)local_2f8._8_8_,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*>.super__Head_base<3UL,_N_*,_false>.
  _M_head_impl = (_Head_base<3UL,_N_*,_false>)(_Head_base<3UL,_N_*,_false>)_Stack_300._M_head_impl;
  N::connect((N *)local_2f8._8_8_,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  N::connect((N *)local_2f8._0_8_,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect((N *)local_2f8._0_8_,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  N::connect(_Stack_300._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  N::connect(_Stack_300._M_head_impl,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*>.super__Head_base<3UL,_N_*,_false>.
  _M_head_impl = (_Head_base<3UL,_N_*,_false>)(_Head_base<3UL,_N_*,_false>)local_328._24_8_;
  N::connect((N *)local_328._32_8_,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*>.super__Head_base<3UL,_N_*,_false>.
  _M_head_impl = (_Head_base<3UL,_N_*,_false>)(_Head_base<3UL,_N_*,_false>)local_328._16_8_;
  N::connect((N *)local_328._24_8_,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Head_base<0UL,_N_*,_false>._M_head_impl,(sockaddr *)&local_398,1);
  local_398.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.
  super__Tuple_impl<2UL,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*>.super__Head_base<3UL,_N_*,_false>.
  _M_head_impl = (_Head_base<3UL,_N_*,_false>)(_Head_base<3UL,_N_*,_false>)local_328._8_8_;
  N::connect((N *)local_328._24_8_,
             (int)local_158.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>.
                  _M_head_impl,(sockaddr *)&local_398,1);
  pNVar1 = (NS *)operator_new(0x18);
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  NS::wrap<NS*,NS*,NS*,NS*>(&local_398,pNVar1,local_338,local_340,local_348,local_350);
  *(NS **)local_330.super__Head_base<0UL,_NS_*,_false>._M_head_impl = pNVar1;
  return (tuple<NS_*>)local_330.super__Head_base<0UL,_NS_*,_false>._M_head_impl;
}

Assistant:

std::tuple<NS*> exelixis_python_solution() {
        auto problem_context_g = new NS();
        auto [digitc, operatorc, parenthesec, symbolc] =
         problem_context_g->wrap("Digit", "Operator", "Parenthese", "Symbol");
        auto [hasf, hass, hasi] =
         problem_context_g->wrap("has function", "has symbol", "has instance");
        auto [splus, smin, stimes, sdiv, sneg, s0, s1, s2, s3, s4, s5, s6, s7, s8, s9, slparen, srparen, sempty] =
         problem_context_g->wrap("+", "-", "*", "/", "-", "0", "1", "2", "3", "4", "5", "6", "7", "8", "9", "(", ")", " ");
        auto [fint, fadd, fsub, fmul, fdiv] =
         problem_context_g->wrap("int", "add", "sub", "mul", "div");

        //digitc->connect(hasi, {s0, s1, s2, s3, s4, s5, s6, s7, s8, s9});
        operatorc->connect(hasi, {splus, smin, stimes, sdiv});
        parenthesec->connect(hasi, {slparen, srparen});
        //symbolc->connect(hasi, {splus, smin, stimes, sdiv, sneg, s0, s1, s2, s3, s4, s5, s6, s7, s8, s9, slparen, srparen, sempty});
        splus->connect(hasf, {fadd}); smin->connect(hasf, {fsub}); stimes->connect(hasf, {fmul}); sdiv->connect(hasf, {fdiv});

        auto solution_context_g = new NS(), parser_ops_g = new NS(), evaluator_ops_g = new NS();
        auto [parser_ops_n, evaluator_ops_n] =
         solution_context_g->wrap(parser_ops_g, evaluator_ops_g);

        auto [firsta, seconda, thirda, anyofa, arga] =
         solution_context_g->wrap("first", "second", "third", "any of", "arg");
        auto [seqo, alto, mulo, somo] =
         parser_ops_g->wrap("Sequence", "Either", "ZeroOrMore", "OneOrMore");
        auto [chaino, heado, joino, filtero, matcheso, mapo, fixo, applyo, swapo] =
         evaluator_ops_g->wrap("Chain", "Head", "Join", "Filter", "Matches", "Map", "Fix", "Apply", "Swap");

        auto parser_g = new NS();
        auto [ps0, ps1, ps2, ps3, ps4, parser] =
         parser_g->wrap("Integer", "Digit", "Factor", "Term", "Expression", "parser");
        auto [ps00, ps01, ps02, ps10, ps20, ps21, ps30, ps31, ps32, ps33, ps40, ps41, ps42, ps43] =
         parser_g->wrap("seq", "alt", "som", "alt", "alt", "seq", "seq", "mul", "seq", "alt", "seq", "mul", "seq", "alt");

        seqo->connect(hasi, {ps00, ps21, ps30, ps32, ps40, ps42});
        alto->connect(hasi, {ps01, ps10, ps20, ps33, ps43});
        somo->connect(hasi, {ps02});
        mulo->connect(hasi, {ps31, ps41});

        ps0->connect(parser, {ps00});
        ps00->connect(firsta, {ps01});
        ps01->connect(anyofa, {sneg, sempty});
        ps00->connect(seconda, {ps02});
        ps02->connect(arga, {ps1});

        ps1->connect(parser, {ps10});
        ps10->connect(anyofa, {s0, s1, s2, s3, s4, s5, s6, s7, s8, s9});

        ps2->connect(parser, {ps20});
        ps20->connect(anyofa, {ps21, ps0});
        ps21->connect(firsta, {slparen});
        ps21->connect(seconda, {ps4});
        ps21->connect(thirda, {srparen});

        ps3->connect(parser, {ps30});
        ps30->connect(firsta, {ps2});
        ps30->connect(seconda, {ps31});
        ps31->connect(arga, {ps32});
        ps32->connect(firsta, {ps33});
        ps32->connect(seconda, {ps2});
        ps33->connect(anyofa, {stimes, sdiv});

        ps4->connect(parser, {ps40});
        ps40->connect(firsta, {ps3});
        ps40->connect(seconda, {ps41});
        ps41->connect(arga, {ps42});
        ps42->connect(firsta, {ps43});
        ps42->connect(seconda, {ps3});
        ps43->connect(anyofa, {splus, smin});

        auto solver_g = new NS();
        auto [solver] =
         solver_g->wrap("solver");
        auto [fs00, fs01, fs10, fs20, fs21, fs22, fs23,
              fs30, fs31, fs32, fs33, fs34, fs35, fs36, fs37, fs38, fs39,
              fs40, fs41, fs42, fs43, fs44, fs45, fs46, fs47, fs48, fs49] =
         solver_g->wrap("chain", "join", "head", "chain", "filter", "filter", "head",
                 "chain", "map", "chain", "matches", "matches", "fix", "chain", "swap", "apply", "head",
                 "chain", "map", "chain", "matches", "matches", "fix", "chain", "swap", "apply", "head");

        chaino->connect(hasi, {fs00, fs20, fs30, fs40, fs32, fs42, fs36, fs46});
        heado->connect(hasi, {fs10, fs23, fs39, fs49});
        joino->connect(hasi, {fs01,});
        filtero->connect(hasi, {fs21, fs22,});
        matcheso->connect(hasi, {fs33, fs43, fs34, fs44});
        mapo->connect(hasi, {fs31, fs41,});
        fixo->connect(hasi, {fs35, fs45});
        applyo->connect(hasi, {fs38, fs48});
        swapo->connect(hasi, {fs37, fs47});

        ps0->connect(solver, {fs00});
        fs00->connect(firsta, {fs01});
        fs00->connect(seconda, {fint});
        fs01->connect(arga, {sempty});

        ps1->connect(solver, {fs10});

        ps2->connect(solver, {fs20});
        fs20->connect(firsta, {fs21});
        fs20->connect(seconda, {fs22});
        fs20->connect(thirda, {fs23});
        fs21->connect(arga, {slparen});
        fs22->connect(arga, {srparen});

        ps3->connect(solver, {fs30});
        fs30->connect(firsta, {fs31});
        fs30->connect(seconda, {fs35});
        fs30->connect(thirda, {fs39});
        fs31->connect(arga, {fs32});
        fs32->connect(firsta, {fs33});
        fs32->connect(seconda, {fs34});
        fs33->connect(firsta, {stimes});
        fs33->connect(seconda, {fmul});
        fs34->connect(firsta, {sdiv});
        fs34->connect(seconda, {fdiv});
        fs35->connect(arga, {fs36});
        fs36->connect(firsta, {fs37});
        fs36->connect(seconda, {fs38});

        ps4->connect(solver, {fs40});
        fs40->connect(firsta, {fs41});
        fs40->connect(seconda, {fs45});
        fs40->connect(thirda, {fs49});
        fs41->connect(arga, {fs42});
        fs42->connect(firsta, {fs43});
        fs42->connect(seconda, {fs44});
        fs43->connect(firsta, {splus});
        fs43->connect(seconda, {fadd});
        fs44->connect(firsta, {smin});
        fs44->connect(seconda, {fsub});
        fs45->connect(arga, {fs46});
        fs46->connect(firsta, {fs47});
        fs46->connect(seconda, {fs48});

        auto universe = new NS();
        /*
        auto [arithmetic, p1, p2, p3, p4] =
         universe->wrap("Arithmetic", "1+1", "2*(10-7)", "(1+2)-(3*4)", "-100/25 + 2*2*2");
        auto [hasc, hasp] =
         universe->wrap("has context", "has problem");*/
        auto [problem_context_n, solution_context_n, parser_n, solver_n] =
         universe->wrap(problem_context_g, solution_context_g, parser_g, solver_g);
        /*
        arithmetic->connect(hasc, {problem_context_n, solution_context_n});
        arithmetic->connect(hasp, {p1, p2, p3, p4});
        arithmetic->connect(parser, {parser_n});
        arithmetic->connect(solver, {solver_n});*/

        return universe;
    }